

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_4,_2> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::matrixCompMult<float,4,2>
          (Matrix<float,_4,_2> *__return_storage_ptr__,MatrixCaseUtils *this,Matrix<float,_4,_2> *a,
          Matrix<float,_4,_2> *b)

{
  long lVar1;
  
  tcu::Matrix<float,_4,_2>::Matrix(__return_storage_ptr__);
  for (lVar1 = -0x10; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(float *)((long)(__return_storage_ptr__->m_data).m_data[1].m_data + lVar1) =
         *(float *)(this + lVar1 + 0x10) * *(float *)((long)(a->m_data).m_data[1].m_data + lVar1);
    *(float *)((long)__return_storage_ptr__[1].m_data.m_data[0].m_data + lVar1) =
         *(float *)(this + lVar1 + 0x20) * *(float *)((long)a[1].m_data.m_data[0].m_data + lVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Rows, Cols> matrixCompMult (const tcu::Matrix<T, Rows, Cols>& a, const tcu::Matrix<T, Rows, Cols>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a(r,c) * b(r, c);

	return retVal;
}